

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

DdNode * Abc_NodeGlobalBdds_rec
                   (DdManager *dd,Abc_Obj_t *pNode,int nBddSizeMax,int fDropInternal,
                   ProgressBar *pProgress,int *pCounter,int fVerbose)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *local_78;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pNodeC;
  DdNode *pDStack_58;
  int fDetectMuxes;
  DdNode *bFuncC;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFunc;
  int *pCounter_local;
  ProgressBar *pProgress_local;
  int fDropInternal_local;
  int nBddSizeMax_local;
  Abc_Obj_t *pNode_local;
  DdManager *dd_local;
  
  pNodeC._4_4_ = 0;
  bFunc = (DdNode *)pCounter;
  pCounter_local = &pProgress->nItemsNext;
  pProgress_local._0_4_ = fDropInternal;
  pProgress_local._4_4_ = nBddSizeMax;
  _fDropInternal_local = pNode;
  pNode_local = (Abc_Obj_t *)dd;
  iVar4 = Abc_ObjIsComplement(pNode);
  if (iVar4 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                  ,0x178,
                  "DdNode *Abc_NodeGlobalBdds_rec(DdManager *, Abc_Obj_t *, int, int, ProgressBar *, int *, int)"
                 );
  }
  uVar5 = Cudd_ReadKeys((DdManager *)pNode_local);
  uVar6 = Cudd_ReadDead((DdManager *)pNode_local);
  if (pProgress_local._4_4_ < uVar5 - uVar6) {
    Extra_ProgressBarStop((ProgressBar *)pCounter_local);
    if (fVerbose != 0) {
      printf("The number of live nodes reached %d.\n",(ulong)pProgress_local._4_4_);
    }
    fflush(_stdout);
    return (DdNode *)0x0;
  }
  pvVar7 = Abc_ObjGlobalBdd(_fDropInternal_local);
  if (pvVar7 == (void *)0x0) {
    pNode1 = Abc_ObjFanin0(_fDropInternal_local);
    local_78 = Abc_ObjFanin1(_fDropInternal_local);
    if (((((pNodeC._4_4_ == 0) || (pvVar7 = Abc_ObjGlobalBdd(pNode1), pvVar7 != (void *)0x0)) ||
         (pvVar7 = Abc_ObjGlobalBdd(local_78), pvVar7 != (void *)0x0)) ||
        ((iVar4 = Abc_ObjIsNode(pNode1), iVar4 == 0 ||
         (iVar4 = Abc_ObjFanoutNum(pNode1), iVar4 != 1)))) ||
       ((iVar4 = Abc_ObjIsNode(local_78), iVar4 == 0 ||
        ((iVar4 = Abc_ObjFanoutNum(local_78), iVar4 != 1 ||
         (iVar4 = Abc_NodeIsMuxType(_fDropInternal_local), iVar4 == 0)))))) {
      pAVar3 = pNode_local;
      pAVar8 = Abc_ObjFanin(_fDropInternal_local,0);
      bFunc1 = Abc_NodeGlobalBdds_rec
                         ((DdManager *)pAVar3,pAVar8,pProgress_local._4_4_,(int)pProgress_local,
                          (ProgressBar *)pCounter_local,(int *)bFunc,fVerbose);
      if (bFunc1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(bFunc1);
      pAVar3 = pNode_local;
      pAVar8 = Abc_ObjFanin(_fDropInternal_local,1);
      bFuncC = Abc_NodeGlobalBdds_rec
                         ((DdManager *)pAVar3,pAVar8,pProgress_local._4_4_,(int)pProgress_local,
                          (ProgressBar *)pCounter_local,(int *)bFunc,fVerbose);
      if (bFuncC == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(bFuncC);
      pDVar2 = bFunc1;
      iVar4 = Abc_ObjFaninC0(_fDropInternal_local);
      pDVar1 = bFuncC;
      bFunc1 = (DdNode *)((ulong)pDVar2 ^ (long)iVar4);
      iVar4 = Abc_ObjFaninC1(_fDropInternal_local);
      bFuncC = (DdNode *)((ulong)pDVar1 ^ (long)iVar4);
      bFunc0 = Cudd_bddAndLimit((DdManager *)pNode_local,bFunc1,bFuncC,pProgress_local._4_4_);
      if (bFunc0 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(bFunc0);
      Cudd_RecursiveDeref((DdManager *)pNode_local,bFunc1);
      Cudd_RecursiveDeref((DdManager *)pNode_local,bFuncC);
      bFunc->index = bFunc->index + 1;
    }
    else {
      (pNode1->vFanouts).nSize = (pNode1->vFanouts).nSize + -1;
      (local_78->vFanouts).nSize = (local_78->vFanouts).nSize + -1;
      pNode0 = Abc_NodeRecognizeMux(_fDropInternal_local,&local_78,&pNode1);
      iVar4 = Abc_ObjFanoutNum(pNode0);
      if (iVar4 < 2) {
        __assert_fail("Abc_ObjFanoutNum(pNodeC) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                      ,0x193,
                      "DdNode *Abc_NodeGlobalBdds_rec(DdManager *, Abc_Obj_t *, int, int, ProgressBar *, int *, int)"
                     );
      }
      (pNode0->vFanouts).nSize = (pNode0->vFanouts).nSize + -1;
      pDStack_58 = Abc_NodeGlobalBdds_rec
                             ((DdManager *)pNode_local,pNode0,pProgress_local._4_4_,
                              (int)pProgress_local,(ProgressBar *)pCounter_local,(int *)bFunc,
                              fVerbose);
      if (pDStack_58 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDStack_58);
      pAVar3 = pNode_local;
      pAVar8 = Abc_ObjRegular(pNode1);
      bFunc1 = Abc_NodeGlobalBdds_rec
                         ((DdManager *)pAVar3,pAVar8,pProgress_local._4_4_,(int)pProgress_local,
                          (ProgressBar *)pCounter_local,(int *)bFunc,fVerbose);
      if (bFunc1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(bFunc1);
      pAVar3 = pNode_local;
      pAVar8 = Abc_ObjRegular(local_78);
      bFuncC = Abc_NodeGlobalBdds_rec
                         ((DdManager *)pAVar3,pAVar8,pProgress_local._4_4_,(int)pProgress_local,
                          (ProgressBar *)pCounter_local,(int *)bFunc,fVerbose);
      if (bFuncC == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(bFuncC);
      pDVar2 = bFunc1;
      iVar4 = Abc_ObjIsComplement(pNode1);
      pDVar1 = bFuncC;
      bFunc1 = (DdNode *)((ulong)pDVar2 ^ (long)iVar4);
      iVar4 = Abc_ObjIsComplement(local_78);
      bFuncC = (DdNode *)((ulong)pDVar1 ^ (long)iVar4);
      bFunc0 = Cudd_bddIte((DdManager *)pNode_local,pDStack_58,bFuncC,bFunc1);
      Cudd_Ref(bFunc0);
      Cudd_RecursiveDeref((DdManager *)pNode_local,bFunc1);
      Cudd_RecursiveDeref((DdManager *)pNode_local,bFuncC);
      Cudd_RecursiveDeref((DdManager *)pNode_local,pDStack_58);
      bFunc->index = bFunc->index + 3;
    }
    pvVar7 = Abc_ObjGlobalBdd(_fDropInternal_local);
    if (pvVar7 != (void *)0x0) {
      __assert_fail("Abc_ObjGlobalBdd(pNode) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                    ,0x1c8,
                    "DdNode *Abc_NodeGlobalBdds_rec(DdManager *, Abc_Obj_t *, int, int, ProgressBar *, int *, int)"
                   );
    }
    Abc_ObjSetGlobalBdd(_fDropInternal_local,bFunc0);
    if (pCounter_local != (int *)0x0) {
      Extra_ProgressBarUpdate((ProgressBar *)pCounter_local,bFunc->index,(char *)0x0);
    }
  }
  bFunc0 = (DdNode *)Abc_ObjGlobalBdd(_fDropInternal_local);
  iVar4 = (_fDropInternal_local->vFanouts).nSize + -1;
  (_fDropInternal_local->vFanouts).nSize = iVar4;
  if ((iVar4 == 0) && ((int)pProgress_local != 0)) {
    Cudd_Deref(bFunc0);
    Abc_ObjSetGlobalBdd(_fDropInternal_local,(void *)0x0);
  }
  return bFunc0;
}

Assistant:

DdNode * Abc_NodeGlobalBdds_rec( DdManager * dd, Abc_Obj_t * pNode, int nBddSizeMax, int fDropInternal, ProgressBar * pProgress, int * pCounter, int fVerbose )
{
    DdNode * bFunc, * bFunc0, * bFunc1, * bFuncC;
    int fDetectMuxes = 0;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Cudd_ReadKeys(dd)-Cudd_ReadDead(dd) > (unsigned)nBddSizeMax )
    {
        Extra_ProgressBarStop( pProgress );
        if ( fVerbose )
        printf( "The number of live nodes reached %d.\n", nBddSizeMax );
        fflush( stdout );
        return NULL;
    }
    // if the result is available return
    if ( Abc_ObjGlobalBdd(pNode) == NULL )
    {
        Abc_Obj_t * pNodeC, * pNode0, * pNode1;
        pNode0 = Abc_ObjFanin0(pNode);
        pNode1 = Abc_ObjFanin1(pNode);
        // check for the special case when it is MUX/EXOR
        if ( fDetectMuxes && 
             Abc_ObjGlobalBdd(pNode0) == NULL && Abc_ObjGlobalBdd(pNode1) == NULL &&
             Abc_ObjIsNode(pNode0) && Abc_ObjFanoutNum(pNode0) == 1 && 
             Abc_ObjIsNode(pNode1) && Abc_ObjFanoutNum(pNode1) == 1 && 
             Abc_NodeIsMuxType(pNode) )
        {
            // deref the fanins
            pNode0->vFanouts.nSize--;
            pNode1->vFanouts.nSize--;
            // recognize the MUX
            pNodeC = Abc_NodeRecognizeMux( pNode, &pNode1, &pNode0 );
            assert( Abc_ObjFanoutNum(pNodeC) > 1 );
            // dereference the control once (the second time it will be derefed when BDDs are computed)
            pNodeC->vFanouts.nSize--;

            // compute the result for all branches
            bFuncC = Abc_NodeGlobalBdds_rec( dd, pNodeC, nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFuncC == NULL )
                return NULL;
            Cudd_Ref( bFuncC );
            bFunc0 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjRegular(pNode0), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc0 == NULL )
                return NULL;
            Cudd_Ref( bFunc0 );
            bFunc1 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjRegular(pNode1), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc1 == NULL )
                return NULL;
            Cudd_Ref( bFunc1 );

            // complement the branch BDDs
            bFunc0 = Cudd_NotCond( bFunc0, (int)Abc_ObjIsComplement(pNode0) );
            bFunc1 = Cudd_NotCond( bFunc1, (int)Abc_ObjIsComplement(pNode1) );
            // get the final result
            bFunc = Cudd_bddIte( dd, bFuncC, bFunc1, bFunc0 );   Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc0 );
            Cudd_RecursiveDeref( dd, bFunc1 );
            Cudd_RecursiveDeref( dd, bFuncC );
            // add the number of used nodes
            (*pCounter) += 3;
        }
        else
        {
            // compute the result for both branches
            bFunc0 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin(pNode,0), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc0 == NULL )
                return NULL;
            Cudd_Ref( bFunc0 );
            bFunc1 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin(pNode,1), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc1 == NULL )
                return NULL;
            Cudd_Ref( bFunc1 );
            bFunc0 = Cudd_NotCond( bFunc0, (int)Abc_ObjFaninC0(pNode) );
            bFunc1 = Cudd_NotCond( bFunc1, (int)Abc_ObjFaninC1(pNode) );
            // get the final result
            bFunc = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddSizeMax );
            if ( bFunc == NULL )
                return NULL;
            Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc0 );
            Cudd_RecursiveDeref( dd, bFunc1 );
            // add the number of used nodes
            (*pCounter)++;
        }
        // set the result
        assert( Abc_ObjGlobalBdd(pNode) == NULL );
        Abc_ObjSetGlobalBdd( pNode, bFunc );
        // increment the progress bar
        if ( pProgress )
            Extra_ProgressBarUpdate( pProgress, *pCounter, NULL );
    }
    // prepare the return value
    bFunc = (DdNode *)Abc_ObjGlobalBdd(pNode);
    // dereference BDD at the node
    if ( --pNode->vFanouts.nSize == 0 && fDropInternal )
    {
        Cudd_Deref( bFunc );
        Abc_ObjSetGlobalBdd( pNode, NULL );
    }
    return bFunc;
}